

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::TransferProcessedObjects
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject *list,FreeObject *tail)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  FreeObject *this_00;
  
  if (tail == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68b,"(tail != nullptr)","tail != nullptr");
    if (!bVar2) goto LAB_00625b43;
    *puVar6 = 0;
  }
  if (list == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68c,"(list)","list");
    if (!bVar2) {
LAB_00625b43:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  tail->taggedNext = 1;
  this_00 = list;
  do {
    if (this_00 == (FreeObject *)0x0) {
      FreeObject::SetNext(tail,this->freeObjectList);
      this->freeObjectList = list;
      CheckDebugFreeBitVector(this,true);
      return;
    }
    BVar5 = IsInFreeObjectList(this,this_00);
    if (BVar5 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x693,"(!this->IsInFreeObjectList(freeObject))",
                         "!this->IsInFreeObjectList(freeObject)");
      if (!bVar2) goto LAB_00625b43;
      *puVar6 = 0;
    }
    uVar4 = GetAddressBitIndex(this_00);
    BVar3 = BVStatic<2048UL>::TestAndSet(&this->debugFreeBits,(uint)uVar4);
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x695,"(!isSet)","!isSet");
      if (!bVar2) goto LAB_00625b43;
      *puVar6 = 0;
    }
    this_00 = FreeObject::GetNext(this_00);
  } while( true );
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::TransferProcessedObjects(FreeObject * list, FreeObject * tail)
{
    Assert(tail != nullptr);
    Assert(list);
#if DBG || defined(RECYCLER_STATS)
    // make sure that object we are transferred to the free list are not freed yet
    tail->SetNext(nullptr);
    FreeObject * freeObject = list;
    while (freeObject != nullptr)
    {
        Assert(!this->IsInFreeObjectList(freeObject));
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(freeObject));
        Assert(!isSet);
        freeObject = freeObject->GetNext();
    }
#endif
    tail->SetNext(this->freeObjectList);
    this->freeObjectList = list;

    RECYCLER_SLOW_CHECK(this->CheckDebugFreeBitVector(true));
}